

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O2

TermList ApplicativeHelper::createAppTerm
                   (TermList sort,TermList head,TermList *args,uint arity,bool shared)

{
  TermList s1;
  ulong uVar1;
  
  for (uVar1 = 0; arity != uVar1; uVar1 = uVar1 + 1) {
    s1 = getNthArg(sort,1);
    sort = getResultApplieadToNArgs(sort,1);
    head = createAppTerm(s1,sort,head,args[uVar1]._content,shared);
  }
  return (TermList)head._content;
}

Assistant:

TermList ApplicativeHelper::createAppTerm(TermList sort, TermList head, TermList* args, unsigned arity, bool shared)
{
  ASS_REP(head.isVar() || SortHelper::getResultSort(head.term()) == sort, sort.toString() );

  TermList res = head;
  TermList s1, s2;

  for(unsigned i = 0; i < arity; i++){
    s1 = getNthArg(sort, 1);
    s2 = getResultApplieadToNArgs(sort, 1);
    res = createAppTerm(s1, s2, res, args[i], shared);
    sort = s2;
  }
  return res; 
}